

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_StopDataSource> * __thiscall
protozero::CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_StopDataSource>::operator=
          (CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_StopDataSource> *this,
          CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_StopDataSource> *other)

{
  GetAsyncCommandResponse_StopDataSource *this_00;
  CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_StopDataSource> *other_local;
  CopyablePtr<perfetto::protos::gen::GetAsyncCommandResponse_StopDataSource> *this_local;
  
  perfetto::std::
  unique_ptr<perfetto::protos::gen::GetAsyncCommandResponse_StopDataSource,_std::default_delete<perfetto::protos::gen::GetAsyncCommandResponse_StopDataSource>_>
  ::operator=(&this->ptr_,&other->ptr_);
  this_00 = (GetAsyncCommandResponse_StopDataSource *)operator_new(0x38);
  perfetto::protos::gen::GetAsyncCommandResponse_StopDataSource::
  GetAsyncCommandResponse_StopDataSource(this_00);
  perfetto::std::
  unique_ptr<perfetto::protos::gen::GetAsyncCommandResponse_StopDataSource,_std::default_delete<perfetto::protos::gen::GetAsyncCommandResponse_StopDataSource>_>
  ::reset(&other->ptr_,this_00);
  return this;
}

Assistant:

CopyablePtr& operator=(CopyablePtr&& other) {
    ptr_ = std::move(other.ptr_);
    other.ptr_.reset(new T());
    return *this;
  }